

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

cmExternalMakefileProjectGeneratorFactory * cmExtraSublimeTextGenerator::GetFactory(void)

{
  int iVar1;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  if (GetFactory()::factory == '\0') {
    iVar1 = __cxa_guard_acquire(&GetFactory()::factory);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Sublime Text 2",&local_59);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Generates Sublime Text 2 project files.",&local_5a);
      cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraSublimeTextGenerator>::
      cmExternalMakefileProjectGeneratorSimpleFactory(&GetFactory::factory,&local_58,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      __cxa_atexit(cmExternalMakefileProjectGeneratorFactory::
                   ~cmExternalMakefileProjectGeneratorFactory,&GetFactory::factory,&__dso_handle);
      __cxa_guard_release(&GetFactory()::factory);
    }
  }
  cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_58,&GetFactory::factory.super_cmExternalMakefileProjectGeneratorFactory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  if (local_58._M_dataplus._M_p == (pointer)local_58._M_string_length) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Ninja",(allocator<char> *)&local_38);
    cmExternalMakefileProjectGeneratorFactory::AddSupportedGlobalGenerator
              (&GetFactory::factory.super_cmExternalMakefileProjectGeneratorFactory,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Unix Makefiles",(allocator<char> *)&local_38);
    cmExternalMakefileProjectGeneratorFactory::AddSupportedGlobalGenerator
              (&GetFactory::factory.super_cmExternalMakefileProjectGeneratorFactory,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return &GetFactory::factory.super_cmExternalMakefileProjectGeneratorFactory;
}

Assistant:

cmExternalMakefileProjectGeneratorFactory*
cmExtraSublimeTextGenerator::GetFactory()
{
  static cmExternalMakefileProjectGeneratorSimpleFactory<
    cmExtraSublimeTextGenerator>
    factory("Sublime Text 2", "Generates Sublime Text 2 project files.");

  if (factory.GetSupportedGlobalGenerators().empty()) {
#if defined(_WIN32)
    factory.AddSupportedGlobalGenerator("MinGW Makefiles");
    factory.AddSupportedGlobalGenerator("NMake Makefiles");
// disable until somebody actually tests it:
// factory.AddSupportedGlobalGenerator("MSYS Makefiles");
#endif
    factory.AddSupportedGlobalGenerator("Ninja");
    factory.AddSupportedGlobalGenerator("Unix Makefiles");
  }

  return &factory;
}